

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
parallel_hash_set<6UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
::swap<std::mutex>(parallel_hash_set<6UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   *this,parallel_hash_set<6UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                         *that)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  
  lVar4 = 0x28;
  do {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)that);
    if (iVar2 != 0) {
      uVar3 = std::__throw_system_error(iVar2);
      __clang_call_terminate(uVar3);
    }
    lVar1 = *(long *)((long)(this->sets_)._M_elems + lVar4 + -0x28);
    *(long *)((long)(this->sets_)._M_elems + lVar4 + -0x28) =
         ((pthread_mutex_t *)((long)that + 0x28))->__align;
    ((pthread_mutex_t *)((long)that + 0x28))->__align = lVar1;
    uVar3 = *(undefined8 *)((long)(this->sets_)._M_elems + lVar4 + -0x20);
    *(undefined8 *)((long)(this->sets_)._M_elems + lVar4 + -0x20) =
         *(undefined8 *)((long)that + 0x30);
    *(undefined8 *)((long)that + 0x30) = uVar3;
    uVar3 = *(undefined8 *)((long)(this->sets_)._M_elems + lVar4 + -0x18);
    *(undefined8 *)((long)(this->sets_)._M_elems + lVar4 + -0x18) =
         *(undefined8 *)((long)that + 0x38);
    *(undefined8 *)((long)that + 0x38) = uVar3;
    uVar3 = *(undefined8 *)((long)(this->sets_)._M_elems + lVar4 + -0x10);
    *(undefined8 *)((long)(this->sets_)._M_elems + lVar4 + -0x10) =
         *(undefined8 *)((long)that + 0x40);
    *(undefined8 *)((long)that + 0x40) = uVar3;
    lVar1 = *(long *)((long)&(this->sets_)._M_elems[0].set_.ctrl_ + lVar4);
    *(long *)((long)&(this->sets_)._M_elems[0].set_.ctrl_ + lVar4) =
         ((pthread_mutex_t *)((long)that + 0x50))->__align;
    ((pthread_mutex_t *)((long)that + 0x50))->__align = lVar1;
    pthread_mutex_unlock((pthread_mutex_t *)that);
    lVar4 = lVar4 + 0x30;
    that = (parallel_hash_set<6UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            *)((long)that + 0x58);
  } while (lVar4 != 0xc28);
  return;
}

Assistant:

void swap(parallel_hash_set<N, RefSet, Mtx2_, Policy, Hash, Eq, Alloc>& that)
        noexcept(IsNoThrowSwappable<EmbeddedSet>() &&
                 (!AllocTraits::propagate_on_container_swap::value ||
                  IsNoThrowSwappable<allocator_type>(typename AllocTraits::propagate_on_container_swap{})))
    {
        using std::swap;
        using Lockable2 = phmap::LockableImpl<Mtx2_>;
         
        for (size_t i=0; i<num_tables; ++i)
        {
            typename Lockable::UniqueLock l(sets_[i]);
            typename Lockable2::UniqueLock l2(that.get_inner(i));
            swap(sets_[i].set_, that.get_inner(i).set_);
        }
    }